

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::values::standard_value<bool>::set_default_and_implicit(standard_value<bool> *this)

{
  (this->super_abstract_value<bool>).m_default = true;
  std::__cxx11::string::assign((char *)&(this->super_abstract_value<bool>).m_default_value);
  (this->super_abstract_value<bool>).m_implicit = true;
  std::__cxx11::string::assign((char *)&(this->super_abstract_value<bool>).m_implicit_value);
  return;
}

Assistant:

void
            set_default_and_implicit()
            {
                m_default = true;
                m_default_value = "false";
                m_implicit = true;
                m_implicit_value = "true";
            }